

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

void fy_diag_cfg_from_parser_flags(fy_diag_cfg *cfg,fy_parse_cfg_flags pflags)

{
  fy_parse_cfg_flags pflags_local;
  fy_diag_cfg *cfg_local;
  
  cfg->level = pflags >> 0xc & 0xf;
  cfg->module_mask = pflags >> 4 & 0xff;
  cfg->field_0x20 = cfg->field_0x20 & 0xfe;
  cfg->field_0x20 =
       cfg->field_0x20 & 0xfd | ((pflags & FYPCF_DEBUG_DIAG_SOURCE) != FYPCF_COLOR_AUTO) << 1;
  cfg->field_0x20 =
       cfg->field_0x20 & 0xfb | ((pflags & FYPCF_DEBUG_DIAG_POSITION) != FYPCF_COLOR_AUTO) << 2;
  cfg->field_0x20 =
       cfg->field_0x20 & 0xf7 | ((pflags & FYPCF_DEBUG_DIAG_TYPE) != FYPCF_COLOR_AUTO) << 3;
  cfg->field_0x20 =
       cfg->field_0x20 & 0xef | ((pflags & FYPCF_DEBUG_DIAG_MODULE) != FYPCF_COLOR_AUTO) << 4;
  return;
}

Assistant:

void fy_diag_cfg_from_parser_flags(struct fy_diag_cfg *cfg, enum fy_parse_cfg_flags pflags) {
    cfg->level = (pflags >> FYPCF_DEBUG_LEVEL_SHIFT) & FYPCF_DEBUG_LEVEL_MASK;
    cfg->module_mask = (pflags >> FYPCF_MODULE_SHIFT) & FYPCF_MODULE_MASK;
    cfg->colorize = false;
    cfg->show_source = !!(pflags & FYPCF_DEBUG_DIAG_SOURCE);
    cfg->show_position = !!(pflags & FYPCF_DEBUG_DIAG_POSITION);
    cfg->show_type = !!(pflags & FYPCF_DEBUG_DIAG_TYPE);
    cfg->show_module = !!(pflags & FYPCF_DEBUG_DIAG_MODULE);
}